

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

bool __thiscall HEkk::bailout(HEkk *this)

{
  double *pdVar1;
  HighsCallback *this_00;
  HighsModelStatus HVar2;
  bool bVar3;
  HighsOptions *pHVar4;
  size_t in_RCX;
  void *in_RDX;
  double extraout_XMM0_Qa;
  reference rVar5;
  allocator local_41;
  string local_40;
  
  if (this->solve_bailout_ != false) goto LAB_003301f0;
  pHVar4 = this->options_;
  if ((pHVar4->super_HighsOptionsStruct).time_limit == INFINITY) {
LAB_00330144:
    if (this->iteration_count_ < (pHVar4->super_HighsOptionsStruct).simplex_iteration_limit) {
      if ((this->callback_->user_callback).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_003301f0;
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->callback_->active,1);
      if ((*rVar5._M_p & rVar5._M_mask) == 0) goto LAB_003301f0;
      HighsCallback::clearHighsCallbackDataOut(this->callback_);
      this_00 = this->callback_;
      (this_00->data_out).simplex_iteration_count = this->iteration_count_;
      std::__cxx11::string::string((string *)&local_40,"Simplex interrupt",&local_41);
      bVar3 = HighsCallback::callbackAction(this_00,1,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (!bVar3) goto LAB_003301f0;
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,"User interrupt\n");
      HVar2 = kInterrupt;
    }
    else {
      HVar2 = kIterationLimit;
    }
  }
  else {
    HighsTimer::read(this->timer_,0,in_RDX,in_RCX);
    pHVar4 = this->options_;
    pdVar1 = &(pHVar4->super_HighsOptionsStruct).time_limit;
    if (extraout_XMM0_Qa < *pdVar1 || extraout_XMM0_Qa == *pdVar1) goto LAB_00330144;
    HVar2 = kTimeLimit;
  }
  this->solve_bailout_ = true;
  this->model_status_ = HVar2;
LAB_003301f0:
  return this->solve_bailout_;
}

Assistant:

bool HEkk::bailout() {
  if (solve_bailout_) {
    // Bailout has already been decided: check that it's for one of these
    // reasons
    assert(model_status_ == HighsModelStatus::kTimeLimit ||
           model_status_ == HighsModelStatus::kIterationLimit ||
           model_status_ == HighsModelStatus::kObjectiveBound ||
           model_status_ == HighsModelStatus::kObjectiveTarget);
  } else if (options_->time_limit < kHighsInf &&
             timer_->read() > options_->time_limit) {
    solve_bailout_ = true;
    model_status_ = HighsModelStatus::kTimeLimit;
  } else if (iteration_count_ >= options_->simplex_iteration_limit) {
    solve_bailout_ = true;
    model_status_ = HighsModelStatus::kIterationLimit;
  } else if (callback_->user_callback &&
             callback_->active[kCallbackSimplexInterrupt]) {
    callback_->clearHighsCallbackDataOut();
    callback_->data_out.simplex_iteration_count = iteration_count_;
    if (callback_->callbackAction(kCallbackSimplexInterrupt,
                                  "Simplex interrupt")) {
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "User interrupt\n");
      solve_bailout_ = true;
      model_status_ = HighsModelStatus::kInterrupt;
    }
  }
  return solve_bailout_;
}